

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall icu_63::PluralFormat::setLocale(PluralFormat *this,Locale *loc,UErrorCode *status)

{
  if (U_ZERO_ERROR < *status) {
    return;
  }
  Locale::operator=(&this->locale,loc);
  MessagePattern::clear(&this->msgPattern);
  if (this->numberFormat != (NumberFormat *)0x0) {
    (*(this->numberFormat->super_Format).super_UObject._vptr_UObject[1])();
  }
  this->numberFormat = (NumberFormat *)0x0;
  this->offset = 0.0;
  PluralSelectorAdapter::reset(&this->pluralRulesWrapper);
  init(this,(EVP_PKEY_CTX *)0x0);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }